

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecode_machine.hpp
# Opt level: O0

void randomx::BytecodeMachine::exe_IMULH_M
               (InstructionByteCode *ibc,int *pc,uint8_t *scratchpad,ProgramConfiguration *config)

{
  uint64_t b;
  uint64_t uVar1;
  uint8_t *in_RDX;
  InstructionByteCode *in_RDI;
  
  uVar1 = *(in_RDI->field_0).idst;
  getScratchpadAddress(in_RDI,in_RDX);
  b = load64((void *)0x12f29e);
  uVar1 = mulh(uVar1,b);
  *(in_RDI->field_0).idst = uVar1;
  return;
}

Assistant:

static void exe_IMULH_M(RANDOMX_EXE_ARGS) {
			*ibc.idst = mulh(*ibc.idst, load64(getScratchpadAddress(ibc, scratchpad)));
		}